

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O3

string * __thiscall
LinearSystem::SwapMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,SwapMatrix *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  ostringstream out;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  if (((this->first_row_ == this->second_row_) &&
      (this->first_main_column_ == this->second_main_column_)) &&
     (this->first_extension_column_ == this->second_extension_column_)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\begin{bmatrix}",0xf);
    std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    bVar4 = this->first_row_ != this->second_row_;
    if (bVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"row: \\\\",7);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,this->first_row_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," \\leftrightarrows ",0x12);
      std::ostream::operator<<((ostream *)poVar3,this->second_row_);
    }
    iVar1 = this->first_main_column_;
    iVar2 = this->second_main_column_;
    if (iVar1 != iVar2) {
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," \\\\",3);
        std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"col: \\\\",7);
      std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,this->first_main_column_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," \\leftrightarrows ",0x12);
      bVar4 = true;
      std::ostream::operator<<((ostream *)poVar3,this->second_main_column_);
    }
    if (this->first_extension_column_ != this->second_extension_column_) {
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," \\\\",3);
        std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
      }
      if (iVar1 == iVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"col: \\\\",7);
        std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
        std::ostream::put((char)local_1a8);
        std::ostream::flush();
      }
      poVar3 = (ostream *)
               std::ostream::operator<<((ostream *)local_1a8,this->first_extension_column_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," \\leftrightarrows ",0x12);
      std::ostream::operator<<((ostream *)poVar3,this->second_extension_column_);
    }
    std::ios::widen((char)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\end{bmatrix}",0xd);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinearSystem::SwapMatrix::ToLaTex() const {
  if (IsEmpty()) {
    return "";
  }
  std::ostringstream out;
  bool started = false;
  out << "\\begin{bmatrix}" << std::endl;
  if (first_row_ != second_row_) {
    started = true;
    out << "row: \\\\" << std::endl;
    out << first_row_  << " \\leftrightarrows " << second_row_;
  }
  bool is_column_writed = false;
  if (first_main_column_ != second_main_column_) {
    if (started) {
      out << " \\\\" << std::endl;
    }
    out << "col: \\\\" << std::endl;
    is_column_writed = true;
    started = true;
    out << first_main_column_ << " \\leftrightarrows " << second_main_column_;
  }
  if (first_extension_column_ != second_extension_column_) {
    if (started) {
      out << " \\\\" << std::endl;
    }
    if (!is_column_writed) {
        out << "col: \\\\" << std::endl;
    }
    out << first_extension_column_ << " \\leftrightarrows " << second_extension_column_;
  }
  out << std::endl;
  out << "\\end{bmatrix}";

  return out.str();
}